

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenu.cpp
# Opt level: O1

void __thiscall
QMenuPrivate::popup(QMenuPrivate *this,QPoint *p,QAction *atAction,PositionFunction positionFunction
                   )

{
  quint8 *pqVar1;
  QRect *pQVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  undefined4 uVar28;
  undefined4 uVar29;
  undefined4 uVar30;
  byte bVar31;
  byte bVar32;
  ushort uVar33;
  QWidget *this_00;
  Data *pDVar34;
  QMenuScroller *pQVar35;
  __uniq_ptr_data<QTLWExtra,_std::default_delete<QTLWExtra>,_true,_true> _Var36;
  QAction *pQVar37;
  ulong uVar38;
  qreal qVar39;
  Representation RVar40;
  Representation RVar41;
  bool bVar42;
  char cVar43;
  ushort uVar44;
  int iVar45;
  int iVar46;
  uint uVar47;
  LayoutDirection LVar48;
  Representation RVar49;
  QObject *pQVar50;
  Data *pDVar51;
  long lVar52;
  QWindow *pQVar53;
  QGraphicsProxyWidget *pQVar54;
  QScreen *pQVar55;
  ulong uVar56;
  QStyle *pQVar57;
  QWidget *pQVar58;
  QPoint QVar59;
  long in_RCX;
  int *piVar60;
  QRect *pQVar61;
  QRect *pQVar62;
  undefined4 uVar63;
  ulong uVar64;
  QRect *pQVar65;
  uint uVar66;
  ulong uVar67;
  int iVar68;
  ulong uVar69;
  long in_FS_OFFSET;
  Representation RVar73;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  int iVar78;
  int iVar79;
  QRect QVar80;
  QPoint mouse;
  QSize menuSizeHint;
  undefined8 local_80;
  undefined8 local_78;
  QPoint local_70;
  QRect local_68;
  QRect local_58;
  QWidget *local_48;
  undefined8 uStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
  pQVar50 = (QObject *)QGuiApplication::screenAt(p);
  if (pQVar50 == (QObject *)0x0) {
    pDVar51 = (Data *)0x0;
  }
  else {
    pDVar51 = (Data *)QtSharedPointer::ExternalRefCountData::getAndRef(pQVar50);
  }
  pDVar34 = (this->popupScreen).wp.d;
  (this->popupScreen).wp.d = pDVar51;
  (this->popupScreen).wp.value = pQVar50;
  if (pDVar34 != (Data *)0x0) {
    LOCK();
    *(int *)pDVar34 = *(int *)pDVar34 + -1;
    UNLOCK();
    if (*(int *)pDVar34 == 0) {
      operator_delete(pDVar34);
    }
  }
  pQVar35 = this->scroll;
  if (pQVar35 != (QMenuScroller *)0x0) {
    if (pQVar35->scrollOffset != 0) {
      this->field_0x420 = this->field_0x420 | 1;
    }
    pQVar35->scrollOffset = 0;
    pQVar35->scrollFlags = '\0';
  }
  this->motions = 0;
  *(ushort *)&this->field_0x420 = (ushort)*(undefined4 *)&this->field_0x420 & 0xe7ff | 0x1000;
  updateLayoutDirection(this);
  QWidget::ensurePolished(this_00);
  if (this->eventLoop == (QEventLoop *)0x0) {
    QWidgetPrivate::createTLExtra(&this->super_QWidgetPrivate);
    _Var36.super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_>._M_t.
    super__Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_>.
    super__Head_base<0UL,_QTLWExtra_*,_false>._M_head_impl =
         (((this->super_QWidgetPrivate).extra._M_t.
           super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
           super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
           super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl)->topextra)._M_t.
         super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_>;
    lVar52 = *(long *)((long)_Var36.
                             super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_>._M_t.
                             super__Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_>.
                             super__Head_base<0UL,_QTLWExtra_*,_false>._M_head_impl + 0xb8);
    if ((lVar52 == 0) || (*(int *)(lVar52 + 4) == 0)) {
      pQVar55 = (QScreen *)0x0;
    }
    else {
      pQVar55 = *(QScreen **)
                 ((long)_Var36.super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_>.
                        _M_t.super__Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_>.
                        super__Head_base<0UL,_QTLWExtra_*,_false>._M_head_impl + 0xc0);
    }
    if (pQVar55 == (QScreen *)0x0) {
      pQVar58 = (QWidget *)QMetaObject::cast((QObject *)&QMenu::staticMetaObject);
      if (pQVar58 != (QWidget *)0x0) {
        pQVar55 = QWidget::screen(pQVar58);
        goto LAB_00462f2e;
      }
      bVar42 = QWidgetPrivate::setScreenForPoint(&this->super_QWidgetPrivate,p);
    }
    else {
LAB_00462f2e:
      bVar42 = QWidgetPrivate::setScreen(&this->super_QWidgetPrivate,pQVar55);
    }
    if (bVar42 != false) {
      this->field_0x420 = this->field_0x420 | 1;
    }
  }
  topCausedWidget(this);
  lVar52 = QMetaObject::cast((QObject *)&QMenuBar::staticMetaObject);
  if (((*(ushort *)&this->field_0x420 & 4) == 0) == (lVar52 == 0)) {
    *(ushort *)&this->field_0x420 =
         (*(ushort *)&this->field_0x420 & 0xfffa) + (ushort)(lVar52 == 0) * 4 + 1;
  }
  pQVar53 = QWidgetPrivate::windowHandle(&this->super_QWidgetPrivate,Direct);
  if (pQVar53 == (QWindow *)0x0) {
    QWidgetPrivate::createWinId(&this->super_QWidgetPrivate);
  }
  topCausedWidget(this);
  lVar52 = QMetaObject::cast((QObject *)&QMenuBar::staticMetaObject);
  QWidget::setAttribute(this_00,WA_X11NetWmWindowTypeDropDownMenu,lVar52 != 0);
  QMetaObject::activate(&this_00->super_QObject,&QMenu::staticMetaObject,0,(void **)0x0);
  bVar31 = this->field_0x420;
  local_68 = (QRect)(ZEXT816(0xffffffffffffffff) << 0x40);
  bVar42 = this_00 != (QWidget *)0x0;
  if (bVar42) {
    bVar32 = *(byte *)((long)&(this_00->data->window_flags).
                              super_QFlagsStorageHelper<Qt::WindowType,_4>.
                              super_QFlagsStorage<Qt::WindowType>.i + 3);
    pQVar58 = this_00;
    while ((bVar32 & 0x20) == 0) {
      pQVar58 = *(QWidget **)(*(long *)&pQVar58->field_0x8 + 0x10);
      bVar42 = pQVar58 != (QWidget *)0x0;
      if (pQVar58 == (QWidget *)0x0) break;
      bVar32 = *(byte *)((long)&(pQVar58->data->window_flags).
                                super_QFlagsStorageHelper<Qt::WindowType,_4>.
                                super_QFlagsStorage<Qt::WindowType>.i + 3);
    }
  }
  if ((bVar42) ||
     (pQVar54 = QWidgetPrivate::nearestGraphicsProxyWidget(this_00),
     pQVar54 == (QGraphicsProxyWidget *)0x0)) {
    pQVar55 = (QScreen *)QGuiApplication::screenAt(p);
  }
  else {
    pQVar55 = (QScreen *)0x0;
  }
  local_68 = popupGeometry(this,pQVar55);
  updateActionRects(this,&local_68);
  local_70.xp.m_i = 0;
  local_70.yp.m_i = 0;
  lVar52 = QMetaObject::cast((QObject *)&QPushButton::staticMetaObject);
  if ((~bVar31 & 1) == 0 && lVar52 != 0) {
    local_70 = QPushButtonPrivate::adjustedMenuPosition(*(QPushButtonPrivate **)(lVar52 + 8));
  }
  else {
    local_70 = *p;
  }
  pQVar50 = (QObject *)QGuiApplication::screenAt(&local_70);
  if (pQVar50 == (QObject *)0x0) {
    pDVar51 = (Data *)0x0;
  }
  else {
    pDVar51 = (Data *)QtSharedPointer::ExternalRefCountData::getAndRef(pQVar50);
  }
  pDVar34 = (this->popupScreen).wp.d;
  (this->popupScreen).wp.d = pDVar51;
  (this->popupScreen).wp.value = pQVar50;
  if (pDVar34 != (Data *)0x0) {
    LOCK();
    *(int *)pDVar34 = *(int *)pDVar34 + -1;
    UNLOCK();
    if (*(int *)pDVar34 == 0) {
      operator_delete(pDVar34);
    }
  }
  local_78 = &DAT_aaaaaaaaaaaaaaaa;
  uVar56 = (**(code **)(*(long *)this_00 + 0x70))(this_00);
  uVar69 = uVar56 >> 0x20;
  local_78 = (undefined1 *)uVar56;
  if (*(long *)(in_RCX + 0x10) != 0) {
    local_70 = (QPoint)(**(code **)(in_RCX + 0x18))();
  }
  pQVar57 = QWidget::style(this_00);
  iVar45 = (**(code **)(*(long *)pQVar57 + 0xe0))(pQVar57,0x20,0,this_00);
  pQVar58 = QWidget::window(this_00);
  bVar42 = QWidget::testAttribute_helper(pQVar58,WA_DontShowOnScreen);
  RVar40.m_i = local_68.y1.m_i;
  RVar41.m_i = local_68.y2.m_i;
  iVar46 = (local_68.y2.m_i - local_68.y1.m_i) + 1;
  iVar78 = (int)(uVar56 >> 0x20);
  if (((iVar46 < iVar78) || ((local_68.x2.m_i - local_68.x1.m_i) + 1 < (int)uVar56)) ||
     ((bVar42 = !bVar42, 1 < this->ncols && (iVar78 < iVar46)))) {
    uVar47 = iVar46 + iVar45 * -2;
    uVar66 = (local_68.x2.m_i - (iVar45 * 2 + local_68.x1.m_i)) + 1;
    if ((int)(uint)local_78 < (int)uVar66) {
      uVar66 = (uint)local_78;
    }
    uVar56 = (ulong)uVar66;
    if ((int)local_78._4_4_ < (int)uVar47) {
      uVar47 = local_78._4_4_;
    }
    bVar42 = true;
    uVar69 = (ulong)uVar47;
  }
  iVar46 = (int)uVar69;
  if (this->ncols < 2) {
    if ((atAction != (QAction *)0x0) && ((this->super_QWidgetPrivate).actions.d.size != 0)) {
      uVar67 = 0;
      lVar52 = 0xc;
      iVar78 = 0;
      do {
        pQVar37 = (this->super_QWidgetPrivate).actions.d.ptr[uVar67];
        if (pQVar37 == atAction) {
          RVar49.m_i = local_70.yp.m_i - iVar78;
          pQVar35 = this->scroll;
          if ((pQVar35 != (QMenuScroller *)0x0) && (RVar49.m_i < iVar45)) {
            pQVar35->scrollFlags = pQVar35->scrollFlags | 1;
            pQVar35->scrollOffset = RVar49.m_i;
            RVar49.m_i = iVar45;
          }
          local_70.yp.m_i = RVar49.m_i;
          if ((pQVar35 != (QMenuScroller *)0x0) && (pQVar35->scrollFlags != '\0')) {
            pQVar57 = QWidget::style(this_00);
            iVar46 = (**(code **)(*(long *)pQVar57 + 0xf0))(pQVar57,0x2d,0,this_00,0);
            if (iVar46 == 0) {
              uVar38 = (this->actionRects).d.size;
              uVar69 = (ulong)(uint)(this->scroll->scrollOffset + iVar78);
              if (uVar67 < uVar38) {
                piVar60 = (int *)((long)&(((this->actionRects).d.ptr)->x1).m_i + lVar52);
                uVar64 = uVar67;
                do {
                  uVar69 = (ulong)((((int)uVar69 + *piVar60) - piVar60[-2]) + 1);
                  uVar64 = uVar64 + 1;
                  piVar60 = piVar60 + 4;
                } while (uVar64 < uVar38);
              }
            }
          }
        }
        else {
          pQVar65 = (this->actionRects).d.ptr;
          iVar78 = ((iVar78 + pQVar65[uVar67].y2.m_i) - pQVar65[uVar67].y1.m_i) + 1;
        }
        iVar46 = (int)uVar69;
        if (pQVar37 == atAction) break;
        uVar67 = uVar67 + 1;
        lVar52 = lVar52 + 0x10;
      } while (uVar67 < (ulong)(this->super_QWidgetPrivate).actions.d.size);
    }
  }
  else {
    local_70.yp.m_i = local_68.y1.m_i + iVar45;
  }
  QVar80 = QWidget::childrenRect(this_00);
  pQVar65 = QVar80._8_8_;
  if ((QVar80.x2.m_i.m_i < QVar80.x1.m_i.m_i) ||
     (pQVar65 = (QRect *)((ulong)pQVar65 >> 0x20), QVar80.y2.m_i.m_i < QVar80.y1.m_i.m_i)) {
    pQVar61 = (this->actionRects).d.ptr;
    lVar52 = (this->actionRects).d.size;
    pQVar2 = pQVar61 + lVar52;
    pQVar62 = pQVar61;
    if (0 < lVar52 >> 2) {
      pQVar62 = (QRect *)((long)&(pQVar61->x1).m_i + (lVar52 * 0x10 & 0xffffffffffffffc0U));
      lVar52 = (lVar52 >> 2) + 1;
      pQVar61 = pQVar61 + 2;
      pQVar65 = pQVar61;
      do {
        uVar3 = pQVar65[-2].x1;
        uVar17 = pQVar65[-2].y1;
        uVar4 = pQVar65[-2].x2;
        uVar18 = pQVar65[-2].y2;
        iVar78 = -(uint)(uVar4 == uVar3 + -1);
        iVar79 = -(uint)(uVar18 == uVar17 + -1);
        auVar74._4_4_ = iVar78;
        auVar74._0_4_ = iVar78;
        auVar74._8_4_ = iVar79;
        auVar74._12_4_ = iVar79;
        iVar78 = movmskpd((int)pQVar61,auVar74);
        if (iVar78 != 3) {
          pQVar65 = pQVar65 + -2;
          goto LAB_004634ed;
        }
        uVar5 = pQVar65[-1].x1;
        uVar19 = pQVar65[-1].y1;
        uVar6 = pQVar65[-1].x2;
        uVar20 = pQVar65[-1].y2;
        iVar78 = -(uint)(uVar6 == uVar5 + -1);
        iVar79 = -(uint)(uVar20 == uVar19 + -1);
        auVar75._4_4_ = iVar78;
        auVar75._0_4_ = iVar78;
        auVar75._8_4_ = iVar79;
        auVar75._12_4_ = iVar79;
        iVar78 = movmskpd(0,auVar75);
        if (iVar78 != 3) {
          pQVar65 = pQVar65 + -1;
          goto LAB_004634ed;
        }
        uVar7 = pQVar65->x1;
        uVar21 = pQVar65->y1;
        uVar8 = pQVar65->x2;
        uVar22 = pQVar65->y2;
        iVar78 = -(uint)(uVar8 == uVar7 + -1);
        iVar79 = -(uint)(uVar22 == uVar21 + -1);
        auVar76._4_4_ = iVar78;
        auVar76._0_4_ = iVar78;
        auVar76._8_4_ = iVar79;
        auVar76._12_4_ = iVar79;
        iVar78 = movmskpd(0,auVar76);
        if (iVar78 != 3) goto LAB_004634ed;
        uVar9 = pQVar65[1].x1;
        uVar23 = pQVar65[1].y1;
        uVar10 = pQVar65[1].x2;
        uVar24 = pQVar65[1].y2;
        iVar78 = -(uint)(uVar10 == uVar9 + -1);
        iVar79 = -(uint)(uVar24 == uVar23 + -1);
        auVar77._4_4_ = iVar78;
        auVar77._0_4_ = iVar78;
        auVar77._8_4_ = iVar79;
        auVar77._12_4_ = iVar79;
        uVar66 = movmskpd(0,auVar77);
        pQVar61 = (QRect *)(ulong)(uVar66 ^ 3);
        if ((uVar66 ^ 3) != 0) {
          pQVar65 = pQVar65 + 1;
          goto LAB_004634ed;
        }
        lVar52 = lVar52 + -1;
        pQVar65 = pQVar65 + 4;
      } while (1 < lVar52);
    }
    uVar63 = SUB84(pQVar65,0);
    lVar52 = (long)pQVar2 - (long)pQVar62 >> 4;
    if (lVar52 == 1) {
LAB_004634b3:
      uVar15 = pQVar62->x1;
      uVar29 = pQVar62->y1;
      uVar16 = pQVar62->x2;
      uVar30 = pQVar62->y2;
      auVar72._0_4_ = -(uint)(uVar16 == uVar15 + -1);
      iVar78 = -(uint)(uVar30 == uVar29 + -1);
      auVar72._4_4_ = auVar72._0_4_;
      auVar72._8_4_ = iVar78;
      auVar72._12_4_ = iVar78;
      iVar78 = movmskpd(uVar63,auVar72);
      pQVar65 = pQVar62;
      if (iVar78 == 3) {
        pQVar65 = pQVar2;
      }
    }
    else if (lVar52 == 2) {
LAB_0046348c:
      uVar13 = pQVar62->x1;
      uVar27 = pQVar62->y1;
      uVar14 = pQVar62->x2;
      uVar28 = pQVar62->y2;
      auVar71._0_4_ = -(uint)(uVar14 == uVar13 + -1);
      iVar78 = -(uint)(uVar28 == uVar27 + -1);
      auVar71._4_4_ = auVar71._0_4_;
      auVar71._8_4_ = iVar78;
      auVar71._12_4_ = iVar78;
      iVar78 = movmskpd(uVar63,auVar71);
      pQVar65 = pQVar62;
      if (iVar78 == 3) {
        pQVar62 = pQVar62 + 1;
        uVar63 = 0;
        goto LAB_004634b3;
      }
    }
    else {
      pQVar65 = pQVar2;
      if ((lVar52 == 3) &&
         (uVar11 = pQVar62->x1, uVar25 = pQVar62->y1, uVar12 = pQVar62->x2, uVar26 = pQVar62->y2,
         auVar70._0_4_ = -(uint)(uVar12 == uVar11 + -1), iVar78 = -(uint)(uVar26 == uVar25 + -1),
         auVar70._4_4_ = auVar70._0_4_, auVar70._8_4_ = iVar78, auVar70._12_4_ = iVar78,
         iVar78 = movmskpd((int)pQVar2,auVar70), pQVar65 = pQVar62, iVar78 == 3)) {
        pQVar62 = pQVar62 + 1;
        uVar63 = 0;
        goto LAB_0046348c;
      }
    }
LAB_004634ed:
    if (pQVar65 == pQVar2) {
      this->eventLoop = (QEventLoop *)0x0;
      pDVar51 = (this->syncAction).wp.d;
      (this->syncAction).wp = (QWeakPointer<QObject>)0x0;
      if (pDVar51 != (Data *)0x0) {
        LOCK();
        *(int *)pDVar51 = *(int *)pDVar51 + -1;
        UNLOCK();
        if (*(int *)pDVar51 == 0) {
          operator_delete(pDVar51);
        }
      }
      goto LAB_00463c6b;
    }
  }
  local_80 = &DAT_aaaaaaaaaaaaaaaa;
  local_80 = (undefined1 *)QGuiApplicationPrivate::QLastCursorPosition::toPoint();
  qVar39 = _operator<<;
  (this->mousePopupPos).xp = QGuiApplicationPrivate::lastCursorPosition;
  (this->mousePopupPos).yp = qVar39;
  pDVar51 = (this->causedPopup).widget.wp.d;
  iVar78 = (int)uVar56;
  if (((pDVar51 == (Data *)0x0) || (*(int *)(pDVar51 + 4) == 0)) ||
     ((this->causedPopup).widget.wp.value == (QObject *)0x0)) {
    RVar49 = (*p).xp;
    RVar73 = (*p).yp;
    local_58.y1.m_i = RVar73.m_i + -3;
    local_58.x1.m_i = RVar49.m_i + -3;
    local_58.y2.m_i = RVar73.m_i + 2;
    local_58.x2.m_i = RVar49.m_i + 2;
    cVar43 = QRect::contains((QPoint *)&local_58,SUB81(&local_80,0));
  }
  else {
    cVar43 = '\0';
  }
  if (bVar42) {
    LVar48 = QWidget::layoutDirection(this_00);
    if (LVar48 == RightToLeft) {
      if (cVar43 != '\0') {
        local_70.xp.m_i = (int)local_80 - iVar78;
      }
      lVar52 = QMetaObject::cast((QObject *)&QMenuBar::staticMetaObject);
      if ((lVar52 != 0) ||
         (lVar52 = QMetaObject::cast((QObject *)&QMenu::staticMetaObject), lVar52 != 0)) {
        local_70.xp.m_i = local_70.xp.m_i - iVar78;
      }
      RVar49.m_i = local_68.x1.m_i + iVar45;
      if (local_70.xp.m_i < RVar49.m_i) {
        iVar79 = (p->xp).m_i;
        if (RVar49.m_i < iVar79) {
          RVar49.m_i = iVar79;
        }
        local_70.xp.m_i = RVar49.m_i;
      }
      if (local_68.x2.m_i - iVar45 < local_70.xp.m_i + iVar78 + -1) {
        iVar79 = (p->xp).m_i - iVar78;
        RVar49.m_i = ((local_68.x2.m_i - iVar45) - iVar78) + 1;
        if (RVar49.m_i < iVar79) {
          RVar49.m_i = iVar79;
        }
LAB_004636e8:
        local_70.xp.m_i = RVar49.m_i;
      }
    }
    else {
      if (local_68.x2.m_i - iVar45 < local_70.xp.m_i + iVar78 + -1) {
        local_70.xp.m_i = ((local_68.x2.m_i - iVar45) - iVar78) + 1;
      }
      RVar49.m_i = local_68.x1.m_i + iVar45;
      if (local_70.xp.m_i < RVar49.m_i) goto LAB_004636e8;
    }
    if (RVar41.m_i - iVar45 < iVar46 + local_70.yp.m_i + -1) {
      if (cVar43 == '\0') {
        iVar79 = (p->yp).m_i - (iVar46 + iVar45);
        RVar49.m_i = (RVar41.m_i - (iVar46 + iVar45)) + 1;
        if (RVar49.m_i < iVar79) {
          RVar49.m_i = iVar79;
        }
      }
      else {
        iVar79 = local_80._4_4_ - (iVar46 + iVar45);
        RVar49.m_i = (RVar41.m_i - (iVar46 + iVar45)) + 1;
        if (iVar79 < RVar49.m_i) {
          RVar49.m_i = iVar79;
        }
      }
      local_70.yp.m_i = RVar49.m_i;
    }
    if (local_70.yp.m_i < RVar40.m_i + iVar45) {
      local_70.yp.m_i = RVar40.m_i + iVar45;
    }
    if (RVar41.m_i - iVar45 < (int)(local_78._4_4_ + local_70.yp.m_i + -1)) {
      if (this->scroll == (QMenuScroller *)0x0) {
        local_70.yp.m_i = (RVar41.m_i - iVar46) + 1;
      }
      else {
        pqVar1 = &this->scroll->scrollFlags;
        *pqVar1 = *pqVar1 | 2;
        RVar49.m_i = local_70.yp.m_i;
        if (local_70.yp.m_i < RVar40.m_i) {
          RVar49.m_i = RVar40.m_i;
        }
        iVar46 = RVar41.m_i - (RVar49.m_i + iVar45 * 2);
      }
    }
  }
  pQVar57 = QWidget::style(this_00);
  iVar45 = (**(code **)(*(long *)pQVar57 + 0xe0))(pQVar57,0x57,0,this_00);
  pQVar58 = (QWidget *)QMetaObject::cast((QObject *)&QMenu::staticMetaObject);
  if (pQVar58 != (QWidget *)0x0) {
    RVar40.m_i = local_68.x1.m_i;
    iVar79 = local_68.x2.m_i + 1;
    if ((int)((uint)local_78 +
              (((pQVar58->data->crect).x2.m_i + iVar45) - (pQVar58->data->crect).x1.m_i) + 1) <
        iVar79 - local_68.x1.m_i) {
      QVar80 = actionRect(*(QMenuPrivate **)&pQVar58->field_0x8,
                          (*(QMenuPrivate **)&pQVar58->field_0x8)->currentAction);
      local_58._0_8_ = QVar80._0_8_;
      QVar59 = QWidget::mapToGlobal(pQVar58,(QPoint *)&local_58);
      RVar49 = QVar59.xp.m_i;
      iVar68 = (RVar49.m_i - QVar80.x1.m_i) + QVar80.x2.m_i.m_i;
      LVar48 = QWidget::layoutDirection(this_00);
      if (LVar48 == RightToLeft) {
        if ((RVar49.m_i - iVar45 < (int)((uint)local_78 + local_70.xp.m_i)) &&
           (local_70.xp.m_i < iVar68)) {
          local_70.xp.m_i = RVar49.m_i - (uint)local_78;
          if ((int)(RVar49.m_i - (uint)local_78) < RVar40.m_i) {
            local_70.xp.m_i = iVar68;
          }
          if (iVar79 < (int)((uint)local_78 + local_70.xp.m_i)) {
            local_70.xp.m_i = RVar40.m_i;
          }
        }
      }
      else if ((local_70.xp.m_i < iVar45 + iVar68) &&
              (RVar49.m_i < (int)(local_70.xp.m_i + (uint)local_78))) {
        local_70.xp.m_i = RVar49.m_i - (uint)local_78;
        if ((int)((uint)local_78 + iVar68) <= iVar79) {
          local_70.xp.m_i = iVar68;
        }
        if (local_70.xp.m_i < RVar40.m_i) {
          local_70.xp.m_i = iVar79 - (uint)local_78;
        }
      }
    }
  }
  pQVar50 = (QObject *)QGuiApplication::screenAt(&local_70);
  if (pQVar50 == (QObject *)0x0) {
    pDVar51 = (Data *)0x0;
  }
  else {
    pDVar51 = (Data *)QtSharedPointer::ExternalRefCountData::getAndRef(pQVar50);
  }
  pDVar34 = (this->popupScreen).wp.d;
  (this->popupScreen).wp.d = pDVar51;
  (this->popupScreen).wp.value = pQVar50;
  if (pDVar34 != (Data *)0x0) {
    LOCK();
    *(int *)pDVar34 = *(int *)pDVar34 + -1;
    UNLOCK();
    if (*(int *)pDVar34 == 0) {
      operator_delete(pDVar34);
    }
  }
  local_58._0_8_ = local_70;
  local_58.y2.m_i = iVar46 + local_70.yp.m_i + -1;
  local_58.x2.m_i = iVar78 + -1 + local_70.xp.m_i;
  QWidget::setGeometry(this_00,&local_58);
  LVar48 = QWidget::layoutDirection(this_00);
  uVar66 = (LVar48 != RightToLeft) + 1;
  LVar48 = QWidget::layoutDirection(this_00);
  if (LVar48 == RightToLeft) {
    if ((cVar43 == '\0') || (iVar78 / 2 + local_70.xp.m_i <= (int)local_80)) {
      lVar52 = QMetaObject::cast((QObject *)&QMenu::staticMetaObject);
      if (lVar52 != 0) {
        iVar79 = iVar78 / 2 + local_70.xp.m_i;
        iVar45 = QWidget::x((QWidget *)(this->causedPopup).widget.wp.value);
        if (iVar45 < iVar79) goto LAB_00463a31;
      }
    }
    else {
LAB_00463a31:
      uVar66 = 2;
    }
  }
  else if ((cVar43 == '\0') || ((int)local_80 <= iVar78 / 2 + local_70.xp.m_i)) {
    lVar52 = QMetaObject::cast((QObject *)&QMenu::staticMetaObject);
    if (lVar52 != 0) {
      iVar79 = iVar78 / 2 + local_70.xp.m_i;
      iVar45 = QWidget::x((QWidget *)(this->causedPopup).widget.wp.value);
      if (iVar79 < iVar45) goto LAB_00463a73;
    }
  }
  else {
LAB_00463a73:
    uVar66 = 1;
  }
  if (cVar43 == '\0') {
LAB_00463ab7:
    lVar52 = QMetaObject::cast((QObject *)&QMenuBar::staticMetaObject);
    if (lVar52 == 0) {
      uVar47 = 8;
    }
    else {
      iVar45 = iVar78 / 2 + local_70.yp.m_i;
      pDVar51 = (this->causedPopup).widget.wp.d;
      if ((pDVar51 == (Data *)0x0) || (*(int *)(pDVar51 + 4) == 0)) {
        pQVar58 = (QWidget *)0x0;
      }
      else {
        pQVar58 = (QWidget *)(this->causedPopup).widget.wp.value;
      }
      local_58._0_8_ = QWidget::pos((QWidget *)(this->causedPopup).widget.wp.value);
      QVar59 = QWidget::mapToGlobal(pQVar58,(QPoint *)&local_58);
      uVar47 = 8;
      if (iVar45 < QVar59.yp.m_i.m_i) goto LAB_00463b23;
    }
  }
  else {
    if (local_80._4_4_ <= iVar46 / 2 + local_70.yp.m_i) goto LAB_00463ab7;
LAB_00463b23:
    uVar47 = 4;
  }
  bVar42 = QApplication::isEffectEnabled(UI_AnimateMenu);
  if (bVar42) {
    lVar52 = QMetaObject::cast((QObject *)&QMenuBar::staticMetaObject);
    if (lVar52 == 0) {
      lVar52 = QMetaObject::cast((QObject *)&QMenu::staticMetaObject);
      if (lVar52 == 0) {
        uVar44 = 1;
      }
      else {
        uVar33 = *(ushort *)(*(long *)(lVar52 + 8) + 0x420);
        uVar44 = uVar33 >> 0xc;
        *(ushort *)(*(long *)(lVar52 + 8) + 0x420) = uVar33 & 0xefff;
      }
    }
    else {
      uVar44 = (ushort)*(byte *)(*(long *)(lVar52 + 8) + 0x2f8);
      *(undefined1 *)(*(long *)(lVar52 + 8) + 0x2f8) = 0;
    }
    if ((uVar44 & 1) == 0) {
      qFadeEffect((QWidget *)0x0,-1);
      qScrollEffect((QWidget *)0x0,8,-1);
      goto LAB_00463c15;
    }
    bVar42 = QApplication::isEffectEnabled(UI_FadeMenu);
    if (bVar42) {
      qFadeEffect(this_00,-1);
    }
    else {
      pDVar51 = (this->causedPopup).widget.wp.d;
      if (((pDVar51 == (Data *)0x0) || (*(int *)(pDVar51 + 4) == 0)) ||
         ((this->causedPopup).widget.wp.value == (QObject *)0x0)) {
        uVar66 = uVar47 | uVar66;
      }
      else {
        lVar52 = QMetaObject::cast((QObject *)&QMenu::staticMetaObject);
        if (lVar52 == 0) {
          uVar66 = uVar47;
        }
      }
      qScrollEffect(this_00,uVar66,-1);
    }
  }
  else {
LAB_00463c15:
    QWidget::show(this_00);
  }
  local_58._0_8_ = QFont::strikeOut;
  local_58.x2.m_i = 6;
  local_58.y2.m_i = -0x55555556;
  uStack_40 = 0xaaaaaaaaffffffff;
  local_48 = this_00;
  QAccessible::updateAccessibility((QAccessibleEvent *)&local_58);
  QAccessibleEvent::~QAccessibleEvent((QAccessibleEvent *)&local_58);
LAB_00463c6b:
  pDVar51 = (this->popupScreen).wp.d;
  (this->popupScreen).wp = (QWeakPointer<QObject>)0x0;
  if (pDVar51 != (Data *)0x0) {
    LOCK();
    *(int *)pDVar51 = *(int *)pDVar51 + -1;
    UNLOCK();
    if (*(int *)pDVar51 == 0) {
      operator_delete(pDVar51);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMenuPrivate::popup(const QPoint &p, QAction *atAction, PositionFunction positionFunction)
{
    Q_Q(QMenu);
    popupScreen = QGuiApplication::screenAt(p);
    QScopeGuard popupScreenGuard([this](){ popupScreen.clear(); });

    if (scroll) { // reset scroll state from last popup
        if (scroll->scrollOffset)
            itemsDirty = 1; // sizeHint will be incorrect if there is previous scroll
        scroll->scrollOffset = 0;
        scroll->scrollFlags = QMenuPrivate::QMenuScroller::ScrollNone;
    }
    tearoffHighlighted = 0;
    motions = 0;
    doChildEffects = true;
    updateLayoutDirection();

    q->ensurePolished(); // Get the right font

    // Ensure that we get correct sizeHints by placing this window on the correct screen.
    // However if the QMenu was constructed with a Qt::Desktop widget as its parent,
    // then initialScreenIndex was set, so we should respect that for the lifetime of this menu.
    // However if eventLoop exists, then exec() already did this by calling createWinId(); so leave it alone. (QTBUG-76162)
    if (!eventLoop) {
        bool screenSet = false;
        QScreen *screen = topData()->initialScreen;
        if (screen) {
            if (setScreen(screen))
                itemsDirty = true;
            screenSet = true;
        } else if (QMenu *parentMenu = qobject_cast<QMenu *>(parent)) {
            // a submenu is always opened from an open parent menu,
            // so show it on the same screen where the parent is. (QTBUG-76162)
            if (setScreen(parentMenu->screen()))
                itemsDirty = true;
            screenSet = true;
        }
        if (!screenSet && setScreenForPoint(p))
            itemsDirty = true;
    }

    const bool contextMenu = isContextMenu();
    if (lastContextMenu != contextMenu) {
        itemsDirty = true;
        lastContextMenu = contextMenu;
    }

    // Until QWidget::metric accepts the screen set on a widget (without having a window handle)
    // we need to make sure we get a window handle. This must be done near here because
    // we want the screen to be correctly set and items to be marked dirty.
    // (and screen set could 'fail' on oldscreen == newScreen if created before causing the
    // itemsDirty not to be set though needed to get the correct size on first show).
    if (!windowHandle()) {
        createWinId();
    }

#if QT_CONFIG(menubar)
    // if this menu is part of a chain attached to a QMenuBar, set the
    // _NET_WM_WINDOW_TYPE_DROPDOWN_MENU X11 window type
    q->setAttribute(Qt::WA_X11NetWmWindowTypeDropDownMenu, qobject_cast<QMenuBar *>(topCausedWidget()) != nullptr);
#endif

    emit q->aboutToShow();
    const bool actionListChanged = itemsDirty;

    QRect screen;
#if QT_CONFIG(graphicsview)
    bool isEmbedded = !bypassGraphicsProxyWidget(q) && QMenuPrivate::nearestGraphicsProxyWidget(q);
    if (isEmbedded)
        screen = popupGeometry();
    else
#endif
    screen = popupGeometry(QGuiApplication::screenAt(p));
    updateActionRects(screen);

    QPoint pos;
    QPushButton *causedButton = qobject_cast<QPushButton*>(causedPopup.widget);
    if (actionListChanged && causedButton)
        pos = QPushButtonPrivate::get(causedButton)->adjustedMenuPosition();
    else
        pos = p;
    popupScreen = QGuiApplication::screenAt(pos);

    const QSize menuSizeHint(q->sizeHint());
    QSize size = menuSizeHint;

    if (positionFunction)
        pos = positionFunction(menuSizeHint);

    const int desktopFrame = q->style()->pixelMetric(QStyle::PM_MenuDesktopFrameWidth, nullptr, q);
    bool adjustToDesktop = !q->window()->testAttribute(Qt::WA_DontShowOnScreen);

    // if the screens have very different geometries and the menu is too big, we have to recalculate
    if ((size.height() > screen.height() || size.width() > screen.width()) ||
        // Layout is not right, we might be able to save horizontal space
        (ncols >1 && size.height() < screen.height())) {
        size.setWidth(qMin(menuSizeHint.width(), screen.width() - desktopFrame * 2));
        size.setHeight(qMin(menuSizeHint.height(), screen.height() - desktopFrame * 2));
        adjustToDesktop = true;
    }

#ifdef QT_KEYPAD_NAVIGATION
    if (!atAction && QApplicationPrivate::keypadNavigationEnabled()) {
        // Try to have one item activated
        if (defaultAction && defaultAction->isEnabled()) {
            atAction = defaultAction;
            // TODO: This works for first level menus, not yet sub menus
        } else {
            for (QAction *action : std::as_const(actions))
                if (action->isEnabled()) {
                    atAction = action;
                    break;
                }
        }
        currentAction = atAction;
    }
#endif
    if (ncols > 1) {
        pos.setY(screen.top() + desktopFrame);
    } else if (atAction) {
        for (int i = 0, above_height = 0; i < actions.size(); i++) {
            QAction *action = actions.at(i);
            if (action == atAction) {
                int newY = pos.y() - above_height;
                if (scroll && newY < desktopFrame) {
                    scroll->scrollFlags = scroll->scrollFlags
                                             | QMenuPrivate::QMenuScroller::ScrollUp;
                    scroll->scrollOffset = newY;
                    newY = desktopFrame;
                }
                pos.setY(newY);

                if (scroll && scroll->scrollFlags != QMenuPrivate::QMenuScroller::ScrollNone
                    && !q->style()->styleHint(QStyle::SH_Menu_FillScreenWithScroll, nullptr, q)) {
                    int below_height = above_height + scroll->scrollOffset;
                    for (int i2 = i; i2 < actionRects.size(); i2++)
                        below_height += actionRects.at(i2).height();
                    size.setHeight(below_height);
                }
                break;
            } else {
                above_height += actionRects.at(i).height();
            }
        }
    }

    // Do nothing if we don't have a valid size, e.g. when all actions are invisible
    // and there are no child widgets.
    const auto rectIsNull = [](const QRect &rect) { return rect.isNull(); };
    if (q->childrenRect().isEmpty()
     && std::all_of(actionRects.cbegin(), actionRects.cend(), rectIsNull)) {
        eventLoop = nullptr;
        syncAction = nullptr;
        return;
    }

    // Note that QGuiApplicationPrivate::lastCursorPosition isn't a QPointF,
    // so these two statements can't be simplified...
    const QPoint mouse = QGuiApplicationPrivate::lastCursorPosition.toPoint();
    mousePopupPos = QGuiApplicationPrivate::lastCursorPosition;
    const bool snapToMouse = !causedPopup.widget && (QRect(p.x() - 3, p.y() - 3, 6, 6).contains(mouse));

    if (adjustToDesktop) {
        // handle popup falling "off screen"
        if (q->isRightToLeft()) {
            if (snapToMouse) // position flowing left from the mouse
                pos.setX(mouse.x() - size.width());

#if QT_CONFIG(menubar)
            // if the menu is in a menubar or is a submenu, it should be right-aligned
            if (qobject_cast<QMenuBar*>(causedPopup.widget) || qobject_cast<QMenu*>(causedPopup.widget))
                pos.rx() -= size.width();
#endif // QT_CONFIG(menubar)

            if (pos.x() < screen.left() + desktopFrame)
                pos.setX(qMax(p.x(), screen.left() + desktopFrame));
            if (pos.x() + size.width() - 1 > screen.right() - desktopFrame)
                pos.setX(qMax(p.x() - size.width(), screen.right() - desktopFrame - size.width() + 1));
        } else {
            if (pos.x() + size.width() - 1 > screen.right() - desktopFrame)
                pos.setX(screen.right() - desktopFrame - size.width() + 1);
            if (pos.x() < screen.left() + desktopFrame)
                pos.setX(screen.left() + desktopFrame);
        }
        if (pos.y() + size.height() - 1 > screen.bottom() - desktopFrame) {
            if (snapToMouse)
                pos.setY(qMin(mouse.y() - (size.height() + desktopFrame), screen.bottom()-desktopFrame-size.height()+1));
            else
                pos.setY(qMax(p.y() - (size.height() + desktopFrame), screen.bottom()-desktopFrame-size.height()+1));
        }

        if (pos.y() < screen.top() + desktopFrame)
            pos.setY(screen.top() + desktopFrame);
        if (pos.y() + menuSizeHint.height() - 1 > screen.bottom() - desktopFrame) {
            if (scroll) {
                scroll->scrollFlags |= uint(QMenuPrivate::QMenuScroller::ScrollDown);
                int y = qMax(screen.y(),pos.y());
                size.setHeight(screen.bottom() - (desktopFrame * 2) - y);
            } else {
                // Too big for screen, bias to see bottom of menu (for some reason)
                pos.setY(screen.bottom() - size.height() + 1);
            }
        }
    }

    const int subMenuOffset = q->style()->pixelMetric(QStyle::PM_SubMenuOverlap, nullptr, q);
    QMenu *caused = qobject_cast<QMenu*>(causedPopup.widget);
    if (caused && caused->geometry().width() + menuSizeHint.width() + subMenuOffset < screen.width()) {
        QRect parentActionRect(caused->d_func()->actionRect(caused->d_func()->currentAction));
        const QPoint actionTopLeft = caused->mapToGlobal(parentActionRect.topLeft());
        parentActionRect.moveTopLeft(actionTopLeft);
        if (q->isRightToLeft()) {
            if ((pos.x() + menuSizeHint.width() > parentActionRect.left() - subMenuOffset)
                && (pos.x() < parentActionRect.right()))
            {
                pos.rx() = parentActionRect.left() - menuSizeHint.width();
                if (pos.x() < screen.x())
                    pos.rx() = parentActionRect.right();
                if (pos.x() + menuSizeHint.width() > screen.x() + screen.width())
                    pos.rx() = screen.x();
            }
        } else {
            if ((pos.x() < parentActionRect.right() + subMenuOffset)
                && (pos.x() + menuSizeHint.width() > parentActionRect.left()))
            {
                pos.rx() = parentActionRect.right();
                if (pos.x() + menuSizeHint.width() > screen.x() + screen.width())
                    pos.rx() = parentActionRect.left() - menuSizeHint.width();
                if (pos.x() < screen.x())
                    pos.rx() = screen.x() + screen.width() - menuSizeHint.width();
            }
        }
    }
    popupScreen = QGuiApplication::screenAt(pos);
    q->setGeometry(QRect(pos, size));
#if QT_CONFIG(effects)
    int hGuess = q->isRightToLeft() ? QEffects::LeftScroll : QEffects::RightScroll;
    int vGuess = QEffects::DownScroll;
    if (q->isRightToLeft()) {
        if ((snapToMouse && (pos.x() + size.width() / 2 > mouse.x())) ||
           (qobject_cast<QMenu*>(causedPopup.widget) && pos.x() + size.width() / 2 > causedPopup.widget->x()))
            hGuess = QEffects::RightScroll;
    } else {
        if ((snapToMouse && (pos.x() + size.width() / 2 < mouse.x())) ||
           (qobject_cast<QMenu*>(causedPopup.widget) && pos.x() + size.width() / 2 < causedPopup.widget->x()))
            hGuess = QEffects::LeftScroll;
    }

#if QT_CONFIG(menubar)
    if ((snapToMouse && (pos.y() + size.height() / 2 < mouse.y())) ||
       (qobject_cast<QMenuBar*>(causedPopup.widget) &&
        pos.y() + size.width() / 2 < causedPopup.widget->mapToGlobal(causedPopup.widget->pos()).y()))
       vGuess = QEffects::UpScroll;
#endif
    if (QApplication::isEffectEnabled(Qt::UI_AnimateMenu)) {
        bool doChildEffects = true;
#if QT_CONFIG(menubar)
        if (QMenuBar *mb = qobject_cast<QMenuBar*>(causedPopup.widget)) {
            doChildEffects = mb->d_func()->doChildEffects;
            mb->d_func()->doChildEffects = false;
        } else
#endif
        if (QMenu *m = qobject_cast<QMenu*>(causedPopup.widget)) {
            doChildEffects = m->d_func()->doChildEffects;
            m->d_func()->doChildEffects = false;
        }

        if (doChildEffects) {
            if (QApplication::isEffectEnabled(Qt::UI_FadeMenu))
                qFadeEffect(q);
            else if (causedPopup.widget)
                qScrollEffect(q, qobject_cast<QMenu*>(causedPopup.widget) ? hGuess : vGuess);
            else
                qScrollEffect(q, hGuess | vGuess);
        } else {
            // kill any running effect
            qFadeEffect(nullptr);
            qScrollEffect(nullptr);

            q->show();
        }
    } else
#endif
    {
        q->show();
    }

#if QT_CONFIG(accessibility)
    QAccessibleEvent event(q, QAccessible::PopupMenuStart);
    QAccessible::updateAccessibility(&event);
#endif
}